

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

void Saig_SynchInitRegsTernary(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  
  if (0 < pAig->nRegs) {
    pVVar2 = pAig->vCis;
    iVar4 = 0;
    do {
      uVar3 = pAig->nTruePis + iVar4;
      if (((int)uVar3 < 0) || (pVVar2->nSize <= (int)uVar3)) {
LAB_006692e4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pVVar2->pArray[uVar3] + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006692e4;
      if (0 < nWords) {
        memset(vSimInfo->pArray[iVar1],0xff,(ulong)(uint)nWords << 2);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < pAig->nRegs);
  }
  return;
}

Assistant:

void Saig_SynchInitRegsTernary( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = 0xffffffff;
    }
}